

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

cl_program __thiscall
CLIntercept::createProgramWithInjectionSPIRV
          (CLIntercept *this,uint64_t hash,cl_context context,cl_int *errcode_ret)

{
  ulong uVar1;
  void *pvVar2;
  cl_program p_Var3;
  float __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  string fileName2;
  string fileName1;
  string fileName;
  ifstream is;
  int aiStack_420 [122];
  char numberString1 [256];
  char numberString2 [256];
  
  std::mutex::lock(&this->m_Mutex);
  if ((this->m_Dispatch).clCreateProgramWithIL == (cl_api_clCreateProgramWithIL)0x0) {
    __x_02 = (double)std::__cxx11::string::string
                               ((string *)&is,
                                "Aborting InjectProgramSPIRV because clCreateProgramWithIL is NULL!\n"
                                ,(allocator *)numberString1);
    log(this,__x_02);
    std::__cxx11::string::~string((string *)&is);
    p_Var3 = (cl_program)0x0;
  }
  else {
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
    fileName._M_string_length = 0;
    fileName.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&is,sc_DumpDirectoryName,(allocator *)numberString1);
    OS::Services_Common::GetDumpDirectoryNameWithoutPid
              (&(this->m_OS).super_Services_Common,(string *)&is,&fileName);
    std::__cxx11::string::~string((string *)&is);
    std::__cxx11::string::append((char *)&fileName);
    memset(numberString1,0,0x100);
    snprintf(numberString1,0x100,"%04u_%08X_0000",(ulong)this->m_ProgramNumber,hash & 0xffffffff);
    memset(numberString2,0,0x100);
    snprintf(numberString2,0x100,"%08X_0000",hash & 0xffffffff);
    fileName1._M_dataplus._M_p = (pointer)&fileName1.field_2;
    fileName1._M_string_length = 0;
    fileName1.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&fileName1);
    std::__cxx11::string::append((char *)&fileName1);
    std::__cxx11::string::append((char *)&fileName1);
    std::__cxx11::string::append((char *)&fileName1);
    fileName2._M_dataplus._M_p = (pointer)&fileName2.field_2;
    fileName2._M_string_length = 0;
    fileName2.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&fileName2);
    std::__cxx11::string::append((char *)&fileName2);
    std::__cxx11::string::append((char *)&fileName2);
    std::__cxx11::string::append((char *)&fileName2);
    std::ifstream::ifstream(&is);
    std::ifstream::open((char *)&is,(_Ios_Openmode)fileName1._M_dataplus._M_p);
    if (*(int *)((long)aiStack_420 + *(long *)(_is + -0x18)) == 0) {
      std::operator+(&local_4e0,"Injecting SPIR-V file: ",&fileName1);
      std::operator+(&local_4c0,&local_4e0,"\n");
      log(this,__x_03);
    }
    else {
      std::operator+(&local_4e0,"Injection SPIR-V file doesn\'t exist: ",&fileName1);
      std::operator+(&local_4c0,&local_4e0,"\n");
      log(this,__x_00);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::ios::clear((int)&is + (int)*(undefined8 *)(_is + -0x18));
      std::ifstream::open((char *)&is,(_Ios_Openmode)fileName2._M_dataplus._M_p);
      if (*(int *)((long)aiStack_420 + *(long *)(_is + -0x18)) == 0) {
        std::operator+(&local_4e0,"Injecting SPIR-V file: ",&fileName2);
        std::operator+(&local_4c0,&local_4e0,"\n");
        log(this,__x_04);
      }
      else {
        std::operator+(&local_4e0,"Injection SPIR-V file doesn\'t exist: ",&fileName2);
        std::operator+(&local_4c0,&local_4e0,"\n");
        log(this,__x_01);
      }
    }
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4e0);
    if (*(int *)((long)aiStack_420 + *(long *)(_is + -0x18)) == 0) {
      std::istream::seekg((long)&is,_S_beg);
      uVar1 = std::istream::tellg();
      std::istream::seekg((long)&is,_S_beg);
      pvVar2 = operator_new__(uVar1);
      std::istream::read((char *)&is,(long)pvVar2);
      p_Var3 = (*(this->m_Dispatch).clCreateProgramWithIL)(context,pvVar2,uVar1,errcode_ret);
      if (p_Var3 != (cl_program)0x0) {
        logf(this,__x);
      }
      operator_delete__(pvVar2);
      std::ifstream::close();
    }
    else {
      p_Var3 = (cl_program)0x0;
    }
    std::ifstream::~ifstream(&is);
    std::__cxx11::string::~string((string *)&fileName2);
    std::__cxx11::string::~string((string *)&fileName1);
    std::__cxx11::string::~string((string *)&fileName);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return p_Var3;
}

Assistant:

cl_program CLIntercept::createProgramWithInjectionSPIRV(
    uint64_t hash,
    cl_context context,
    cl_int* errcode_ret )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_program  program = NULL;

    // Don't bother with any of this if we weren't able to get a pointer to
    // the entry point to create a program with IL.
    if( dispatch().clCreateProgramWithIL == NULL )
    {
        log( "Aborting InjectProgramSPIRV because clCreateProgramWithIL is NULL!\n" );
    }
    else
    {
        std::string fileName;

        // Get the dump directory name.
        {
            OS().GetDumpDirectoryNameWithoutPid(sc_DumpDirectoryName, fileName);
            fileName += "/Inject";
        }

        // Make three candidate file names.  They will have the form:
        //   CLI_<program number>_<hash>_0000.spv, or
        //   CLI_<hash>_0000.spv
        {
            char    numberString1[256] = "";
            CLI_SPRINTF(numberString1, 256, "%04u_%08X_0000",
                m_ProgramNumber,
                (unsigned int)hash);

            char    numberString2[256] = "";
            CLI_SPRINTF(numberString2, 256, "%08X_0000",
                (unsigned int)hash);

            std::string fileName1;
            fileName1 = fileName;
            fileName1 += "/CLI_";
            fileName1 += numberString1;
            fileName1 += ".spv";

            std::string fileName2;
            fileName2 = fileName;
            fileName2 += "/CLI_";
            fileName2 += numberString2;
            fileName2 += ".spv";

            std::ifstream is;

            is.open(
                fileName1.c_str(),
                std::ios::in | std::ios::binary);
            if( is.good() )
            {
                log("Injecting SPIR-V file: " + fileName1 + "\n");
            }
            else
            {
                log("Injection SPIR-V file doesn't exist: " + fileName1 + "\n");

                is.clear();
                is.open(
                    fileName2.c_str(),
                    std::ios::in | std::ios::binary);
                if( is.good() )
                {
                    log("Injecting SPIR-V file: " + fileName2 + "\n");
                }
                else
                {
                    log("Injection SPIR-V file doesn't exist: " + fileName2 + "\n");
                }
            }

            if( is.good() )
            {
                // The file exists.  Figure out how big it is.
                size_t  filesize = 0;

                is.seekg( 0, std::ios::end );
                filesize = (size_t)is.tellg();
                is.seekg( 0, std::ios::beg );

                char*   newILBinary = new char[ filesize ];
                if( newILBinary == NULL )
                {
                    CLI_ASSERT( 0 );
                }
                else
                {
                    is.read(newILBinary, filesize);

                    // Right now, this can still die in the ICD loader if the ICD loader
                    // exports this entry point but the vendor didn't implement it.  It
                    // would be nice to enhance the ICD loader so it called into a safe
                    // stub function if the vendor didn't implement an entry point...
                    program = dispatch().clCreateProgramWithIL(
                        context,
                        newILBinary,
                        filesize,
                        errcode_ret );
                    if( program )
                    {
                        logf("Injection successful: clCreateProgramWithIL() returned %p\n",
                            program );
                    }

                    delete[] newILBinary;
                }

                is.close();
            }
        }
    }

    return program;
}